

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,spv_operand_pattern_t *pattern)

{
  iterator iVar1;
  spv_operand_type_t local_10;
  spv_operand_type_t local_c;
  
  local_c = type;
  switch(type) {
  case SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE:
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar1,
                 &local_c);
    }
    else {
      *iVar1._M_current = type;
LAB_005f1966:
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    break;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar1,
                 &local_c);
    }
    else {
      *iVar1._M_current = type;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_10 = SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER;
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current !=
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *iVar1._M_current = SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER;
      goto LAB_005f19cb;
    }
    goto LAB_005f19d5;
  case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar1,
                 &local_c);
    }
    else {
      *iVar1._M_current = type;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_10 = SPV_OPERAND_TYPE_ID;
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
      _M_realloc_insert<spv_operand_type_t>(pattern,iVar1,&local_10);
    }
    else {
      *iVar1._M_current = SPV_OPERAND_TYPE_ID;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_10 = SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER;
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_005f19d5;
    *iVar1._M_current = SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER;
    goto LAB_005f19cb;
  case SPV_OPERAND_TYPE_LAST_OPTIONAL_TYPE:
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
      _M_realloc_insert<spv_operand_type_t_const&>
                ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)pattern,iVar1,
                 &local_c);
    }
    else {
      *iVar1._M_current = type;
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_10 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    iVar1._M_current =
         (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current !=
        (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *iVar1._M_current = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      goto LAB_005f1966;
    }
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
    _M_realloc_insert<spv_operand_type_t>(pattern,iVar1,&local_10);
    break;
  default:
    return false;
  }
  local_10 = SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE;
  iVar1._M_current =
       (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
LAB_005f19d5:
    std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
    _M_realloc_insert<spv_operand_type_t>(pattern,iVar1,&local_10);
  }
  else {
    *iVar1._M_current = SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE;
LAB_005f19cb:
    (pattern->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return true;
}

Assistant:

bool spvExpandOperandSequenceOnce(spv_operand_type_t type,
                                  spv_operand_pattern_t* pattern) {
  switch (type) {
    case SPV_OPERAND_TYPE_VARIABLE_ID:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER:
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_LITERAL_INTEGER_ID:
      // Represents Zero or more (Literal number, Id) pairs,
      // where the literal number must be a scalar integer.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_ID);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER);
      return true;
    case SPV_OPERAND_TYPE_VARIABLE_ID_LITERAL_INTEGER:
      // Represents Zero or more (Id, Literal number) pairs.
      pattern->push_back(type);
      pattern->push_back(SPV_OPERAND_TYPE_LITERAL_INTEGER);
      pattern->push_back(SPV_OPERAND_TYPE_OPTIONAL_ID);
      return true;
    default:
      break;
  }
  return false;
}